

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::RenderTextClipped
               (ImVec2 *pos_min,ImVec2 *pos_max,char *text,char *text_end,ImVec2 *text_size_if_known
               ,ImVec2 *align,ImRect *clip_rect)

{
  ImGuiWindow *pIVar1;
  ImVec2 IVar2;
  bool bVar3;
  bool bVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  ImRect *pIVar9;
  ImU32 col;
  char *pcVar10;
  ImVec2 *pIVar11;
  char *text_end_00;
  ImGuiContext *g;
  ImGuiContext *pIVar12;
  ImFont *font;
  float fVar13;
  char *pcVar14;
  char *pcVar15;
  ImDrawList *this;
  uint uVar16;
  ImVec2 IVar17;
  float fVar18;
  float fVar19;
  ImVec2 pos;
  ImVec4 *cpu_fine_clip_rect;
  ImVec2 local_80;
  ImVec2 *local_78;
  ImGuiContext *local_70;
  undefined1 local_68 [16];
  ImVec4 local_58;
  ImVec2 local_40;
  float local_38;
  float local_34;
  
  pIVar12 = GImGui;
  pcVar10 = (char *)(-(ulong)(text_end == (char *)0x0) | (ulong)text_end);
  pcVar15 = text;
  pcVar14 = text;
  if (text < pcVar10) {
    do {
      pcVar15 = pcVar14;
      if (*pcVar14 == '#') {
        if (pcVar14[1] == '#') break;
      }
      else if (*pcVar14 == '\0') break;
      pcVar14 = pcVar14 + 1;
      pcVar15 = pcVar10;
    } while (pcVar14 != pcVar10);
  }
  if ((int)pcVar15 != (int)text) {
    pIVar1 = GImGui->CurrentWindow;
    pIVar1->Accessed = true;
    IVar2 = *pos_min;
    fVar18 = IVar2.x;
    local_80 = IVar2;
    if (text_size_if_known == (ImVec2 *)0x0) {
      local_70 = pIVar12;
      local_78 = pos_max;
      local_68 = ZEXT416((uint)fVar18);
      IVar17 = CalcTextSize(text,pcVar15,false,0.0);
      fVar18 = local_68._0_4_;
      pIVar12 = local_70;
      pos_max = local_78;
    }
    else {
      IVar17 = *text_size_if_known;
    }
    fVar13 = IVar2.y;
    pIVar11 = &clip_rect->Max;
    pIVar9 = clip_rect;
    if (clip_rect == (ImRect *)0x0) {
      pIVar11 = pos_max;
      pIVar9 = (ImRect *)pos_min;
    }
    bVar3 = true;
    if (IVar17.x + fVar18 < pIVar11->x) {
      bVar3 = pIVar11->y <= IVar17.y + fVar13;
    }
    if (clip_rect != (ImRect *)0x0) {
      bVar4 = true;
      if ((clip_rect->Min).x <= fVar18) {
        bVar4 = fVar13 < (clip_rect->Min).y;
      }
      bVar3 = (bool)(bVar3 | bVar4);
    }
    if (0.0 < align->x) {
      fVar19 = ((pos_max->x - fVar18) - IVar17.x) * align->x + fVar18;
      uVar16 = -(uint)(fVar19 <= fVar18);
      local_80.x = (float)(uVar16 & (uint)fVar18 | ~uVar16 & (uint)fVar19);
    }
    if (0.0 < align->y) {
      fVar18 = ((pos_max->y - fVar13) - IVar17.y) * align->y + fVar13;
      uVar16 = -(uint)(fVar18 <= fVar13);
      local_80.y = (float)(uVar16 & (uint)fVar13 | ~uVar16 & (uint)fVar18);
    }
    if (bVar3) {
      local_34 = pIVar11->y;
      local_40 = pIVar9->Min;
      cpu_fine_clip_rect = (ImVec4 *)&local_40;
      this = pIVar1->DrawList;
      font = pIVar12->Font;
      fVar18 = pIVar12->FontSize;
      local_58.x = (GImGui->Style).Colors[0].x;
      local_58.y = (GImGui->Style).Colors[0].y;
      uVar5 = (GImGui->Style).Colors[0].z;
      uVar6 = (GImGui->Style).Colors[0].w;
      local_58.w = (GImGui->Style).Alpha * (float)uVar6;
      local_58.z = (float)uVar5;
      local_38 = pIVar11->x;
      col = ColorConvertFloat4ToU32(&local_58);
    }
    else {
      this = pIVar1->DrawList;
      font = pIVar12->Font;
      fVar18 = pIVar12->FontSize;
      local_58.x = (GImGui->Style).Colors[0].x;
      local_58.y = (GImGui->Style).Colors[0].y;
      uVar7 = (GImGui->Style).Colors[0].z;
      uVar8 = (GImGui->Style).Colors[0].w;
      local_58.w = (GImGui->Style).Alpha * (float)uVar8;
      local_58.z = (float)uVar7;
      col = ColorConvertFloat4ToU32(&local_58);
      cpu_fine_clip_rect = (ImVec4 *)0x0;
    }
    ImDrawList::AddText(this,font,fVar18,&local_80,col,text,pcVar15,0.0,cpu_fine_clip_rect);
    if (pIVar12->LogEnabled == true) {
      LogRenderedText((ImVec2 *)text,pcVar15,text_end_00);
    }
  }
  return;
}

Assistant:

void ImGui::RenderTextClipped(const ImVec2& pos_min, const ImVec2& pos_max, const char* text, const char* text_end, const ImVec2* text_size_if_known, const ImVec2& align, const ImRect* clip_rect)
{
    // Hide anything after a '##' string
    const char* text_display_end = FindRenderedTextEnd(text, text_end);
    const int text_len = (int)(text_display_end - text);
    if (text_len == 0)
        return;

    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = GetCurrentWindow();

    // Perform CPU side clipping for single clipped element to avoid using scissor state
    ImVec2 pos = pos_min;
    const ImVec2 text_size = text_size_if_known ? *text_size_if_known : CalcTextSize(text, text_display_end, false, 0.0f);

    const ImVec2* clip_min = clip_rect ? &clip_rect->Min : &pos_min;
    const ImVec2* clip_max = clip_rect ? &clip_rect->Max : &pos_max;
    bool need_clipping = (pos.x + text_size.x >= clip_max->x) || (pos.y + text_size.y >= clip_max->y);
    if (clip_rect) // If we had no explicit clipping rectangle then pos==clip_min
        need_clipping |= (pos.x < clip_min->x) || (pos.y < clip_min->y);

    // Align whole block. We should defer that to the better rendering function when we'll have support for individual line alignment.
    if (align.x > 0.0f) pos.x = ImMax(pos.x, pos.x + (pos_max.x - pos.x - text_size.x) * align.x);
    if (align.y > 0.0f) pos.y = ImMax(pos.y, pos.y + (pos_max.y - pos.y - text_size.y) * align.y);

    // Render
    if (need_clipping)
    {
        ImVec4 fine_clip_rect(clip_min->x, clip_min->y, clip_max->x, clip_max->y);
        window->DrawList->AddText(g.Font, g.FontSize, pos, GetColorU32(ImGuiCol_Text), text, text_display_end, 0.0f, &fine_clip_rect);
    }
    else
    {
        window->DrawList->AddText(g.Font, g.FontSize, pos, GetColorU32(ImGuiCol_Text), text, text_display_end, 0.0f, NULL);
    }
    if (g.LogEnabled)
        LogRenderedText(pos, text, text_display_end);
}